

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCostSchedule::IfcCostSchedule(IfcCostSchedule *this)

{
  IfcCostSchedule *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1d8,"IfcCostSchedule");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00fa8f00);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>,
             &PTR_construction_vtable_24__00fa8fb0);
  *(undefined8 *)this = 0xfa8e20;
  *(undefined8 *)&this->field_0x1d8 = 0xfa8ee8;
  *(undefined8 *)&this->field_0x88 = 0xfa8e48;
  *(undefined8 *)&this->field_0x98 = 0xfa8e70;
  *(undefined8 *)&this->field_0xd0 = 0xfa8e98;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>)._vptr_ObjectHelper =
       (_func_int **)0xfa8ec0;
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe
            ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>).field_0x10);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->PreparedBy);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->SubmittedOn);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Status);
  STEP::Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>_>::Maybe
            (&this->TargetUsers);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->UpdateDate);
  std::__cxx11::string::string((string *)&this->ID);
  std::__cxx11::string::string((string *)&this->PredefinedType);
  return;
}

Assistant:

IfcCostSchedule() : Object("IfcCostSchedule") {}